

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O1

Gia_Man_t * Unr_ManUnroll(Gia_Man_t *pGia,int nFrames)

{
  Unr_Man_t *p;
  Gia_Man_t *pGVar1;
  int f;
  
  p = Unr_ManUnrollStart(pGia,1);
  if (0 < nFrames) {
    f = 0;
    do {
      Unr_ManUnrollFrame(p,f);
      f = f + 1;
    } while (nFrames != f);
  }
  pGVar1 = Gia_ManCleanup(p->pFrames);
  Unr_ManFree(p);
  return pGVar1;
}

Assistant:

Gia_Man_t * Unr_ManUnroll( Gia_Man_t * pGia, int nFrames )
{
    Unr_Man_t * p;
    Gia_Man_t * pFrames;
    int f;
    p = Unr_ManUnrollStart( pGia, 1 );
    for ( f = 0; f < nFrames; f++ )
        Unr_ManUnrollFrame( p, f );
    pFrames = Gia_ManCleanup( p->pFrames );
    Unr_ManFree( p );
    return pFrames;
}